

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

IdentifierNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdentifierNameSyntax,slang::syntax::IdentifierNameSyntax_const&>
          (BumpAllocator *this,IdentifierNameSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  IdentifierNameSyntax *pIVar8;
  
  pIVar8 = (IdentifierNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IdentifierNameSyntax *)this->endPtr < pIVar8 + 1) {
    pIVar8 = (IdentifierNameSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pIVar8 + 1);
  }
  (pIVar8->identifier).info = (args->identifier).info;
  SVar6 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  TVar2 = (args->identifier).kind;
  uVar3 = (args->identifier).field_0x2;
  NVar4.raw = (args->identifier).numFlags.raw;
  uVar5 = (args->identifier).rawLen;
  (pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  (pIVar8->identifier).kind = TVar2;
  (pIVar8->identifier).field_0x2 = uVar3;
  (pIVar8->identifier).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar8->identifier).rawLen = uVar5;
  (pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar7;
  (pIVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }